

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilInfoFlip(Sim_Man_t *p,Abc_Obj_t *pNode)

{
  void *pvVar1;
  void *pvVar2;
  int local_2c;
  int k;
  uint *pSimInfo2;
  uint *pSimInfo1;
  Abc_Obj_t *pNode_local;
  Sim_Man_t *p_local;
  
  pvVar1 = p->vSim0->pArray[pNode->Id];
  pvVar2 = p->vSim1->pArray[pNode->Id];
  for (local_2c = 0; local_2c < p->nSimWords; local_2c = local_2c + 1) {
    *(uint *)((long)pvVar2 + (long)local_2c * 4) =
         *(uint *)((long)pvVar1 + (long)local_2c * 4) ^ 0xffffffff;
  }
  return;
}

Assistant:

void Sim_UtilInfoFlip( Sim_Man_t * p, Abc_Obj_t * pNode )
{
    unsigned * pSimInfo1, * pSimInfo2;
    int k;
    pSimInfo1 = (unsigned *)p->vSim0->pArray[pNode->Id];
    pSimInfo2 = (unsigned *)p->vSim1->pArray[pNode->Id];
    for ( k = 0; k < p->nSimWords; k++ )
        pSimInfo2[k] = ~pSimInfo1[k];
}